

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O0

int yang_fill_type(lys_module *module,lys_type *type,yang_type *stype,void *parent,
                  unres_schema *unres)

{
  int iVar1;
  int local_3c;
  int i;
  unres_schema *unres_local;
  void *parent_local;
  yang_type *stype_local;
  lys_type *type_local;
  lys_module *module_local;
  
  type->parent = (lys_tpdf *)parent;
  iVar1 = yang_check_ext_instance(module,&type->ext,(uint)type->ext_size,type,unres);
  if (iVar1 == 0) {
    switch(stype->base) {
    case LY_TYPE_BITS:
      for (local_3c = 0; local_3c < (type->info).bits.count; local_3c = local_3c + 1) {
        iVar1 = yang_check_iffeatures
                          (module,(type->info).bits.bit + local_3c,parent,BIT_KEYWORD,unres);
        if (iVar1 != 0) {
          return 1;
        }
        iVar1 = yang_check_ext_instance
                          (module,&(type->info).bits.bit[local_3c].ext,
                           (uint)(type->info).bits.bit[local_3c].ext_size,
                           (type->info).bits.bit + local_3c,unres);
        if (iVar1 != 0) {
          return 1;
        }
      }
      break;
    default:
      break;
    case LY_TYPE_DEC64:
      if (((type->info).bits.bit != (lys_type_bit *)0x0) &&
         (iVar1 = yang_check_ext_instance
                            (module,&((type->info).dec64.range)->ext,
                             (uint)((type->info).dec64.range)->ext_size,(type->info).bits.bit,unres)
         , iVar1 != 0)) {
        return 1;
      }
      break;
    case LY_TYPE_ENUM:
      for (local_3c = 0; local_3c < (type->info).bits.count; local_3c = local_3c + 1) {
        iVar1 = yang_check_iffeatures
                          (module,(type->info).bits.bit + local_3c,parent,ENUM_KEYWORD,unres);
        if (iVar1 != 0) {
          return 1;
        }
        iVar1 = yang_check_ext_instance
                          (module,&(type->info).bits.bit[local_3c].ext,
                           (uint)(type->info).bits.bit[local_3c].ext_size,
                           (type->info).bits.bit + local_3c,unres);
        if (iVar1 != 0) {
          return 1;
        }
      }
      break;
    case LY_TYPE_IDENT:
      iVar1 = yang_check_identityref(module,type,unres);
      if (iVar1 != 0) {
        return 1;
      }
      break;
    case LY_TYPE_STRING:
      if (((type->info).bits.bit != (lys_type_bit *)0x0) &&
         (iVar1 = yang_check_ext_instance
                            (module,&((type->info).dec64.range)->ext,
                             (uint)((type->info).dec64.range)->ext_size,(type->info).bits.bit,unres)
         , iVar1 != 0)) {
        return 1;
      }
      for (local_3c = 0; local_3c < (type->info).str.pat_count; local_3c = local_3c + 1) {
        iVar1 = yang_check_ext_instance
                          (module,(lys_ext_instance ***)
                                  (((type->info).lref.target)->padding + (long)local_3c * 0x38 + 0xc
                                  ),(uint)((type->info).lref.target)->padding
                                          [(long)local_3c * 0x38 + 0x14],
                           ((type->info).lref.target)->padding + (long)local_3c * 0x38 + -0x1c,unres
                          );
        if (iVar1 != 0) {
          return 1;
        }
      }
      break;
    case LY_TYPE_UNION:
      for (local_3c = 0; local_3c < (type->info).bits.count; local_3c = local_3c + 1) {
        iVar1 = yang_fill_type(module,(lys_type *)
                                      ((long)(type->info).bits.bit + (long)local_3c * 0x40),
                               *(yang_type **)
                                ((long)(type->info).bits.bit + (long)local_3c * 0x40 + 0x18),parent,
                               unres);
        if (iVar1 != 0) {
          return 1;
        }
      }
    }
    module_local._4_4_ = 0;
  }
  else {
    module_local._4_4_ = 1;
  }
  return module_local._4_4_;
}

Assistant:

int
yang_fill_type(struct lys_module *module, struct lys_type *type, struct yang_type *stype,
               void *parent, struct unres_schema *unres)
{
    int i;

    type->parent = parent;
    if (yang_check_ext_instance(module, &type->ext, type->ext_size, type, unres)) {
        return EXIT_FAILURE;
    }
    switch (stype->base) {
    case LY_TYPE_ENUM:
        for (i = 0; i < type->info.enums.count; ++i) {
            if (yang_check_iffeatures(module, &type->info.enums.enm[i], parent, ENUM_KEYWORD, unres)) {
                return EXIT_FAILURE;
            }
            if (yang_check_ext_instance(module, &type->info.enums.enm[i].ext, type->info.enums.enm[i].ext_size,
                                        &type->info.enums.enm[i], unres)) {
                return EXIT_FAILURE;
            }
        }
        break;
    case LY_TYPE_BITS:
        for (i = 0; i < type->info.bits.count; ++i) {
            if (yang_check_iffeatures(module, &type->info.bits.bit[i], parent, BIT_KEYWORD, unres)) {
                return EXIT_FAILURE;
            }
            if (yang_check_ext_instance(module, &type->info.bits.bit[i].ext, type->info.bits.bit[i].ext_size,
                                        &type->info.bits.bit[i], unres)) {
                return EXIT_FAILURE;
            }
        }
        break;
    case LY_TYPE_IDENT:
        if (yang_check_identityref(module, type, unres)) {
            return EXIT_FAILURE;
        }
        break;
    case LY_TYPE_STRING:
        if (type->info.str.length && yang_check_ext_instance(module, &type->info.str.length->ext,
                                                             type->info.str.length->ext_size, type->info.str.length, unres)) {
            return EXIT_FAILURE;
        }
        for (i = 0; i < type->info.str.pat_count; ++i) {
            if (yang_check_ext_instance(module, &type->info.str.patterns[i].ext, type->info.str.patterns[i].ext_size,
                                        &type->info.str.patterns[i], unres)) {
                return EXIT_FAILURE;
            }
        }
        break;
    case LY_TYPE_DEC64:
        if (type->info.dec64.range && yang_check_ext_instance(module, &type->info.dec64.range->ext,
                                                             type->info.dec64.range->ext_size, type->info.dec64.range, unres)) {
            return EXIT_FAILURE;
        }
        break;
    case LY_TYPE_UNION:
        for (i = 0; i < type->info.uni.count; ++i) {
            if (yang_fill_type(module, &type->info.uni.types[i], (struct yang_type *)type->info.uni.types[i].der,
                               parent, unres)) {
                return EXIT_FAILURE;
            }
        }
        break;
    default:
        /* nothing checks */
        break;
    }
    return EXIT_SUCCESS;
}